

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleInstallMode(cmSetPropertyCommand *this)

{
  bool bVar1;
  cmake *this_00;
  reference name_00;
  cmInstalledFile *file_00;
  ostream *poVar2;
  string local_1f0;
  ostringstream local_1c0 [8];
  ostringstream e;
  cmInstalledFile *file;
  string *name;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmake *cm;
  cmSetPropertyCommand *this_local;
  
  this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->Names);
  name = (string *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->Names);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&name);
    if (!bVar1) {
      return true;
    }
    name_00 = std::
              _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&__end1);
    file_00 = cmake::GetOrCreateInstalledFile(this_00,(this->super_cmCommand).Makefile,name_00);
    if (file_00 == (cmInstalledFile *)0x0) break;
    bVar1 = HandleInstall(this,file_00);
    if (!bVar1) {
      return false;
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::ostringstream::ostringstream(local_1c0);
  poVar2 = std::operator<<((ostream *)local_1c0,
                           "given INSTALL name that could not be found or created: ");
  std::operator<<(poVar2,(string *)name_00);
  std::__cxx11::ostringstream::str();
  cmCommand::SetError(&this->super_cmCommand,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream(local_1c0);
  return false;
}

Assistant:

bool cmSetPropertyCommand::HandleInstallMode()
{
  cmake* cm = this->Makefile->GetCMakeInstance();

  for (std::string const& name : this->Names) {
    if (cmInstalledFile* file =
          cm->GetOrCreateInstalledFile(this->Makefile, name)) {
      if (!this->HandleInstall(file)) {
        return false;
      }
    } else {
      std::ostringstream e;
      e << "given INSTALL name that could not be found or created: " << name;
      this->SetError(e.str());
      return false;
    }
  }
  return true;
}